

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeSimilarFunctions.cpp
# Opt level: O0

Pass * wasm::createMergeSimilarFunctionsPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x58);
  memset(this,0,0x58);
  MergeSimilarFunctions::MergeSimilarFunctions((MergeSimilarFunctions *)this);
  return this;
}

Assistant:

Pass* createMergeSimilarFunctionsPass() { return new MergeSimilarFunctions(); }